

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer-test.c++
# Opt level: O0

void __thiscall capnp::compiler::anon_unknown_0::TestCase236::run(TestCase236 *this)

{
  int iVar1;
  char *pcVar2;
  ArrayPtr<const_char> local_318;
  String local_308;
  char *local_2f0;
  bool local_2e1;
  undefined1 auStack_2e0 [7];
  bool _kj_shouldLog_7;
  String local_2d0;
  ArrayPtr<const_char> local_2b8;
  String local_2a8;
  char *local_290;
  bool local_281;
  undefined1 auStack_280 [7];
  bool _kj_shouldLog_6;
  String local_270;
  ArrayPtr<const_char> local_258;
  String local_248;
  char *local_230;
  bool local_221;
  undefined1 auStack_220 [7];
  bool _kj_shouldLog_5;
  String local_210;
  ArrayPtr<const_char> local_1f8;
  String local_1e8;
  char *local_1d0;
  bool local_1c1;
  undefined1 auStack_1c0 [7];
  bool _kj_shouldLog_4;
  String local_1b0;
  ArrayPtr<const_char> local_198;
  String local_188;
  char *local_170;
  bool local_161;
  undefined1 auStack_160 [7];
  bool _kj_shouldLog_3;
  String local_150;
  ArrayPtr<const_char> local_138;
  String local_128;
  char *local_110;
  bool local_101;
  undefined1 auStack_100 [7];
  bool _kj_shouldLog_2;
  String local_f0;
  ArrayPtr<const_char> local_d8;
  String local_c8;
  char *local_b0;
  bool local_a1;
  undefined1 auStack_a0 [7];
  bool _kj_shouldLog_1;
  String local_90;
  ArrayPtr<const_char> local_78;
  String local_68;
  char *local_50;
  bool local_45;
  bool _kj_shouldLog;
  ArrayPtr<const_char> local_38;
  String local_28;
  TestCase236 *local_10;
  TestCase236 *this_local;
  
  local_10 = this;
  kj::StringPtr::StringPtr((StringPtr *)&local_38,"foo; # blah blah");
  doLex<capnp::compiler::LexedStatements>(&local_28,(StringPtr)local_38);
  pcVar2 = kj::String::cStr(&local_28);
  iVar1 = strcmp("(statements = [(tokens = [(identifier = \'foo\', startByte = 0, endByte = 3)], line = void, docComment = \'blah blah\\n\', startByte = 0, endByte = 16)])"
                 ,pcVar2);
  kj::String::~String(&local_28);
  if (iVar1 != 0) {
    local_45 = kj::_::Debug::shouldLog(ERROR);
    while (local_45 != false) {
      kj::StringPtr::StringPtr((StringPtr *)&local_78,"foo; # blah blah");
      doLex<capnp::compiler::LexedStatements>(&local_68,(StringPtr)local_78);
      local_50 = kj::String::cStr(&local_68);
      kj::_::Debug::log<char_const(&)[262],char_const(&)[149],char_const*>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/lexer-test.c++"
                 ,0xf8,ERROR,
                 "\"failed: expected \" \"::strcmp(\\\"(statements = [\\\" \\\"(\\\" \\\"tokens = [\\\" \\\"(identifier = \'foo\', startByte = 0, endByte = 3)\\\" \\\"], \\\" \\\"line = void, \\\" \\\"docComment = \'blah blah\\\\\\\\n\', \\\" \\\"startByte = 0, endByte = 16\\\" \\\")\\\" \\\"])\\\", doLex<LexedStatements>(\\\"foo; # blah blah\\\").cStr()) == 0\", \"(statements = [\" \"(\" \"tokens = [\" \"(identifier = \'foo\', startByte = 0, endByte = 3)\" \"], \" \"line = void, \" \"docComment = \'blah blah\\\\n\', \" \"startByte = 0, endByte = 16\" \")\" \"])\", doLex<LexedStatements>(\"foo; # blah blah\").cStr()"
                 ,(char (*) [262])
                  "failed: expected ::strcmp(\"(statements = [\" \"(\" \"tokens = [\" \"(identifier = \'foo\', startByte = 0, endByte = 3)\" \"], \" \"line = void, \" \"docComment = \'blah blah\\\\n\', \" \"startByte = 0, endByte = 16\" \")\" \"])\", doLex<LexedStatements>(\"foo; # blah blah\").cStr()) == 0"
                 ,(char (*) [149])
                  "(statements = [(tokens = [(identifier = \'foo\', startByte = 0, endByte = 3)], line = void, docComment = \'blah blah\\n\', startByte = 0, endByte = 16)])"
                 ,&local_50);
      kj::String::~String(&local_68);
      local_45 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_a0,"foo; #blah blah");
  doLex<capnp::compiler::LexedStatements>(&local_90,(StringPtr)_auStack_a0);
  pcVar2 = kj::String::cStr(&local_90);
  iVar1 = strcmp("(statements = [(tokens = [(identifier = \'foo\', startByte = 0, endByte = 3)], line = void, docComment = \'blah blah\\n\', startByte = 0, endByte = 15)])"
                 ,pcVar2);
  kj::String::~String(&local_90);
  if (iVar1 != 0) {
    local_a1 = kj::_::Debug::shouldLog(ERROR);
    while (local_a1 != false) {
      kj::StringPtr::StringPtr((StringPtr *)&local_d8,"foo; #blah blah");
      doLex<capnp::compiler::LexedStatements>(&local_c8,(StringPtr)local_d8);
      local_b0 = kj::String::cStr(&local_c8);
      kj::_::Debug::log<char_const(&)[261],char_const(&)[149],char_const*>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/lexer-test.c++"
                 ,0x105,ERROR,
                 "\"failed: expected \" \"::strcmp(\\\"(statements = [\\\" \\\"(\\\" \\\"tokens = [\\\" \\\"(identifier = \'foo\', startByte = 0, endByte = 3)\\\" \\\"], \\\" \\\"line = void, \\\" \\\"docComment = \'blah blah\\\\\\\\n\', \\\" \\\"startByte = 0, endByte = 15\\\" \\\")\\\" \\\"])\\\", doLex<LexedStatements>(\\\"foo; #blah blah\\\").cStr()) == 0\", \"(statements = [\" \"(\" \"tokens = [\" \"(identifier = \'foo\', startByte = 0, endByte = 3)\" \"], \" \"line = void, \" \"docComment = \'blah blah\\\\n\', \" \"startByte = 0, endByte = 15\" \")\" \"])\", doLex<LexedStatements>(\"foo; #blah blah\").cStr()"
                 ,(char (*) [261])
                  "failed: expected ::strcmp(\"(statements = [\" \"(\" \"tokens = [\" \"(identifier = \'foo\', startByte = 0, endByte = 3)\" \"], \" \"line = void, \" \"docComment = \'blah blah\\\\n\', \" \"startByte = 0, endByte = 15\" \")\" \"])\", doLex<LexedStatements>(\"foo; #blah blah\").cStr()) == 0"
                 ,(char (*) [149])
                  "(statements = [(tokens = [(identifier = \'foo\', startByte = 0, endByte = 3)], line = void, docComment = \'blah blah\\n\', startByte = 0, endByte = 15)])"
                 ,&local_b0);
      kj::String::~String(&local_c8);
      local_a1 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_100,"foo; #  blah blah");
  doLex<capnp::compiler::LexedStatements>(&local_f0,(StringPtr)_auStack_100);
  pcVar2 = kj::String::cStr(&local_f0);
  iVar1 = strcmp("(statements = [(tokens = [(identifier = \'foo\', startByte = 0, endByte = 3)], line = void, docComment = \' blah blah\\n\', startByte = 0, endByte = 17)])"
                 ,pcVar2);
  kj::String::~String(&local_f0);
  if (iVar1 != 0) {
    local_101 = kj::_::Debug::shouldLog(ERROR);
    while (local_101 != false) {
      kj::StringPtr::StringPtr((StringPtr *)&local_138,"foo; #  blah blah");
      doLex<capnp::compiler::LexedStatements>(&local_128,(StringPtr)local_138);
      local_110 = kj::String::cStr(&local_128);
      kj::_::Debug::log<char_const(&)[264],char_const(&)[150],char_const*>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/lexer-test.c++"
                 ,0x112,ERROR,
                 "\"failed: expected \" \"::strcmp(\\\"(statements = [\\\" \\\"(\\\" \\\"tokens = [\\\" \\\"(identifier = \'foo\', startByte = 0, endByte = 3)\\\" \\\"], \\\" \\\"line = void, \\\" \\\"docComment = \' blah blah\\\\\\\\n\', \\\" \\\"startByte = 0, endByte = 17\\\" \\\")\\\" \\\"])\\\", doLex<LexedStatements>(\\\"foo; #  blah blah\\\").cStr()) == 0\", \"(statements = [\" \"(\" \"tokens = [\" \"(identifier = \'foo\', startByte = 0, endByte = 3)\" \"], \" \"line = void, \" \"docComment = \' blah blah\\\\n\', \" \"startByte = 0, endByte = 17\" \")\" \"])\", doLex<LexedStatements>(\"foo; #  blah blah\").cStr()"
                 ,(char (*) [264])
                  "failed: expected ::strcmp(\"(statements = [\" \"(\" \"tokens = [\" \"(identifier = \'foo\', startByte = 0, endByte = 3)\" \"], \" \"line = void, \" \"docComment = \' blah blah\\\\n\', \" \"startByte = 0, endByte = 17\" \")\" \"])\", doLex<LexedStatements>(\"foo; #  blah blah\").cStr()) == 0"
                 ,(char (*) [150])
                  "(statements = [(tokens = [(identifier = \'foo\', startByte = 0, endByte = 3)], line = void, docComment = \' blah blah\\n\', startByte = 0, endByte = 17)])"
                 ,&local_110);
      kj::String::~String(&local_128);
      local_101 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_160,"foo;\n# blah blah");
  doLex<capnp::compiler::LexedStatements>(&local_150,(StringPtr)_auStack_160);
  pcVar2 = kj::String::cStr(&local_150);
  iVar1 = strcmp("(statements = [(tokens = [(identifier = \'foo\', startByte = 0, endByte = 3)], line = void, docComment = \'blah blah\\n\', startByte = 0, endByte = 16)])"
                 ,pcVar2);
  kj::String::~String(&local_150);
  if (iVar1 != 0) {
    local_161 = kj::_::Debug::shouldLog(ERROR);
    while (local_161 != false) {
      kj::StringPtr::StringPtr((StringPtr *)&local_198,"foo;\n# blah blah");
      doLex<capnp::compiler::LexedStatements>(&local_188,(StringPtr)local_198);
      local_170 = kj::String::cStr(&local_188);
      kj::_::Debug::log<char_const(&)[263],char_const(&)[149],char_const*>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/lexer-test.c++"
                 ,0x11f,ERROR,
                 "\"failed: expected \" \"::strcmp(\\\"(statements = [\\\" \\\"(\\\" \\\"tokens = [\\\" \\\"(identifier = \'foo\', startByte = 0, endByte = 3)\\\" \\\"], \\\" \\\"line = void, \\\" \\\"docComment = \'blah blah\\\\\\\\n\', \\\" \\\"startByte = 0, endByte = 16\\\" \\\")\\\" \\\"])\\\", doLex<LexedStatements>(\\\"foo;\\\\n# blah blah\\\").cStr()) == 0\", \"(statements = [\" \"(\" \"tokens = [\" \"(identifier = \'foo\', startByte = 0, endByte = 3)\" \"], \" \"line = void, \" \"docComment = \'blah blah\\\\n\', \" \"startByte = 0, endByte = 16\" \")\" \"])\", doLex<LexedStatements>(\"foo;\\n# blah blah\").cStr()"
                 ,(char (*) [263])
                  "failed: expected ::strcmp(\"(statements = [\" \"(\" \"tokens = [\" \"(identifier = \'foo\', startByte = 0, endByte = 3)\" \"], \" \"line = void, \" \"docComment = \'blah blah\\\\n\', \" \"startByte = 0, endByte = 16\" \")\" \"])\", doLex<LexedStatements>(\"foo;\\n# blah blah\").cStr()) == 0"
                 ,(char (*) [149])
                  "(statements = [(tokens = [(identifier = \'foo\', startByte = 0, endByte = 3)], line = void, docComment = \'blah blah\\n\', startByte = 0, endByte = 16)])"
                 ,&local_170);
      kj::String::~String(&local_188);
      local_161 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_1c0,"foo;\n\n# blah blah");
  doLex<capnp::compiler::LexedStatements>(&local_1b0,(StringPtr)_auStack_1c0);
  pcVar2 = kj::String::cStr(&local_1b0);
  iVar1 = strcmp("(statements = [(tokens = [(identifier = \'foo\', startByte = 0, endByte = 3)], line = void, startByte = 0, endByte = 4)])"
                 ,pcVar2);
  kj::String::~String(&local_1b0);
  if (iVar1 != 0) {
    local_1c1 = kj::_::Debug::shouldLog(ERROR);
    while (local_1c1 != false) {
      kj::StringPtr::StringPtr((StringPtr *)&local_1f8,"foo;\n\n# blah blah");
      doLex<capnp::compiler::LexedStatements>(&local_1e8,(StringPtr)local_1f8);
      local_1d0 = kj::String::cStr(&local_1e8);
      kj::_::Debug::log<char_const(&)[232],char_const(&)[120],char_const*>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/lexer-test.c++"
                 ,299,ERROR,
                 "\"failed: expected \" \"::strcmp(\\\"(statements = [\\\" \\\"(\\\" \\\"tokens = [\\\" \\\"(identifier = \'foo\', startByte = 0, endByte = 3)\\\" \\\"], \\\" \\\"line = void, \\\" \\\"startByte = 0, endByte = 4\\\" \\\")\\\" \\\"])\\\", doLex<LexedStatements>(\\\"foo;\\\\n\\\\n# blah blah\\\").cStr()) == 0\", \"(statements = [\" \"(\" \"tokens = [\" \"(identifier = \'foo\', startByte = 0, endByte = 3)\" \"], \" \"line = void, \" \"startByte = 0, endByte = 4\" \")\" \"])\", doLex<LexedStatements>(\"foo;\\n\\n# blah blah\").cStr()"
                 ,(char (*) [232])
                  "failed: expected ::strcmp(\"(statements = [\" \"(\" \"tokens = [\" \"(identifier = \'foo\', startByte = 0, endByte = 3)\" \"], \" \"line = void, \" \"startByte = 0, endByte = 4\" \")\" \"])\", doLex<LexedStatements>(\"foo;\\n\\n# blah blah\").cStr()) == 0"
                 ,(char (*) [120])
                  "(statements = [(tokens = [(identifier = \'foo\', startByte = 0, endByte = 3)], line = void, startByte = 0, endByte = 4)])"
                 ,&local_1d0);
      kj::String::~String(&local_1e8);
      local_1c1 = false;
    }
  }
  kj::StringPtr::StringPtr
            ((StringPtr *)auStack_220,"foo;\n # bar baz\n  # qux corge\n\n# grault\n# garply");
  doLex<capnp::compiler::LexedStatements>(&local_210,(StringPtr)_auStack_220);
  pcVar2 = kj::String::cStr(&local_210);
  iVar1 = strcmp("(statements = [(tokens = [(identifier = \'foo\', startByte = 0, endByte = 3)], line = void, docComment = \'bar baz\\nqux corge\\n\', startByte = 0, endByte = 30)])"
                 ,pcVar2);
  kj::String::~String(&local_210);
  if (iVar1 != 0) {
    local_221 = kj::_::Debug::shouldLog(ERROR);
    while (local_221 != false) {
      kj::StringPtr::StringPtr
                ((StringPtr *)&local_258,"foo;\n # bar baz\n  # qux corge\n\n# grault\n# garply");
      doLex<capnp::compiler::LexedStatements>(&local_248,(StringPtr)local_258);
      local_230 = kj::String::cStr(&local_248);
      kj::_::Debug::log<char_const(&)[309],char_const(&)[158],char_const*>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/lexer-test.c++"
                 ,0x138,ERROR,
                 "\"failed: expected \" \"::strcmp(\\\"(statements = [\\\" \\\"(\\\" \\\"tokens = [\\\" \\\"(identifier = \'foo\', startByte = 0, endByte = 3)\\\" \\\"], \\\" \\\"line = void, \\\" \\\"docComment = \'bar baz\\\\\\\\nqux corge\\\\\\\\n\', \\\" \\\"startByte = 0, endByte = 30\\\" \\\")\\\" \\\"])\\\", doLex<LexedStatements>(\\\"foo;\\\\n # bar baz\\\\n  # qux corge\\\\n\\\\n# grault\\\\n# garply\\\").cStr()) == 0\", \"(statements = [\" \"(\" \"tokens = [\" \"(identifier = \'foo\', startByte = 0, endByte = 3)\" \"], \" \"line = void, \" \"docComment = \'bar baz\\\\nqux corge\\\\n\', \" \"startByte = 0, endByte = 30\" \")\" \"])\", doLex<LexedStatements>(\"foo;\\n # bar baz\\n  # qux corge\\n\\n# grault\\n# garply\").cStr()"
                 ,(char (*) [309])
                  "failed: expected ::strcmp(\"(statements = [\" \"(\" \"tokens = [\" \"(identifier = \'foo\', startByte = 0, endByte = 3)\" \"], \" \"line = void, \" \"docComment = \'bar baz\\\\nqux corge\\\\n\', \" \"startByte = 0, endByte = 30\" \")\" \"])\", doLex<LexedStatements>(\"foo;\\n # bar baz\\n  # qux corge\\n\\n# grault\\n# garply\").cStr()) == 0"
                 ,(char (*) [158])
                  "(statements = [(tokens = [(identifier = \'foo\', startByte = 0, endByte = 3)], line = void, docComment = \'bar baz\\nqux corge\\n\', startByte = 0, endByte = 30)])"
                 ,&local_230);
      kj::String::~String(&local_248);
      local_221 = false;
    }
  }
  kj::StringPtr::StringPtr
            ((StringPtr *)auStack_280,"foo {# blah blah\nbar; # hi\n baz;} # ignored\nqux;");
  doLex<capnp::compiler::LexedStatements>(&local_270,(StringPtr)_auStack_280);
  pcVar2 = kj::String::cStr(&local_270);
  iVar1 = strcmp("(statements = [(tokens = [(identifier = \'foo\', startByte = 0, endByte = 3)], block = [(tokens = [(identifier = \'bar\', startByte = 17, endByte = 20)], line = void, docComment = \'hi\\n\', startByte = 17, endByte = 27), (tokens = [(identifier = \'baz\', startByte = 28, endByte = 31)], line = void, startByte = 28, endByte = 32)], docComment = \'blah blah\\n\', startByte = 0, endByte = 44), (tokens = [(identifier = \'qux\', startByte = 44, endByte = 47)], line = void, startByte = 44, endByte = 48)])"
                 ,pcVar2);
  kj::String::~String(&local_270);
  if (iVar1 != 0) {
    local_281 = kj::_::Debug::shouldLog(ERROR);
    while (local_281 != false) {
      kj::StringPtr::StringPtr
                ((StringPtr *)&local_2b8,"foo {# blah blah\nbar; # hi\n baz;} # ignored\nqux;");
      doLex<capnp::compiler::LexedStatements>(&local_2a8,(StringPtr)local_2b8);
      local_290 = kj::String::cStr(&local_2a8);
      kj::_::Debug::log<char_const(&)[670],char_const(&)[491],char_const*>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/lexer-test.c++"
                 ,0x14f,ERROR,
                 "\"failed: expected \" \"::strcmp(\\\"(statements = [\\\" \\\"(\\\" \\\"tokens = [\\\" \\\"(identifier = \'foo\', startByte = 0, endByte = 3)\\\" \\\"], \\\" \\\"block = [\\\" \\\"(tokens = [\\\" \\\"(identifier = \'bar\', startByte = 17, endByte = 20)\\\" \\\"], line = void, docComment = \'hi\\\\\\\\n\', startByte = 17, endByte = 27), \\\" \\\"(tokens = [\\\" \\\"(identifier = \'baz\', startByte = 28, endByte = 31)\\\" \\\"], line = void, startByte = 28, endByte = 32)\\\" \\\"], \\\" \\\"docComment = \'blah blah\\\\\\\\n\', \\\" \\\"startByte = 0, endByte = 44\\\" \\\"), \\\" \\\"(tokens = [\\\" \\\"(identifier = \'qux\', startByte = 44, endByte = 47)\\\" \\\"], line = void, startByte = 44, endByte = 48)\\\" \\\"])\\\", doLex<LexedStatements>(\\\"foo {# blah blah\\\\nbar; # hi\\\\n baz;} # ignored\\\\nqux;\\\").cStr()) == 0\", \"(statements = [\" \"(\" \"tokens = [\" \"(identifier = \'foo\', startByte = 0, endByte = 3)\" \"], \" \"block = [\" \"(tokens = [\" \"(identifier = \'bar\', startByte = 17, endByte = 20)\" \"], line = void, docComment = \'hi\\\\n\', startByte = 17, endByte = 27), \" \"(tokens = [\" \"(identifier = \'baz\', startByte = 28, endByte = 31)\" \"], line = void, startByte = 28, endByte = 32)\" \"], \" \"docComment = \'blah blah\\\\n\', \" \"startByte = 0, endByte = 44\" \"), \" \"(tokens = [\" \"(identifier = \'qux\', startByte = 44, endByte = 47)\" \"], line = void, startByte = 44, endByte = 48)\" \"])\", doLex<LexedStatements>(\"foo {# blah blah\\nbar; # hi\\n baz;} # ignored\\nqux;\").cStr()"
                 ,(char (*) [670])
                  "failed: expected ::strcmp(\"(statements = [\" \"(\" \"tokens = [\" \"(identifier = \'foo\', startByte = 0, endByte = 3)\" \"], \" \"block = [\" \"(tokens = [\" \"(identifier = \'bar\', startByte = 17, endByte = 20)\" \"], line = void, docComment = \'hi\\\\n\', startByte = 17, endByte = 27), \" \"(tokens = [\" \"(identifier = \'baz\', startByte = 28, endByte = 31)\" \"], line = void, startByte = 28, endByte = 32)\" \"], \" \"docComment = \'blah blah\\\\n\', \" \"startByte = 0, endByte = 44\" \"), \" \"(tokens = [\" \"(identifier = \'qux\', startByte = 44, endByte = 47)\" \"], line = void, startByte = 44, endByte = 48)\" \"])\", doLex<LexedStatements>(\"foo {# blah blah\\nbar; # hi\\n baz;} # ignored\\nqux;\").cStr()) == 0"
                 ,(char (*) [491])
                  "(statements = [(tokens = [(identifier = \'foo\', startByte = 0, endByte = 3)], block = [(tokens = [(identifier = \'bar\', startByte = 17, endByte = 20)], line = void, docComment = \'hi\\n\', startByte = 17, endByte = 27), (tokens = [(identifier = \'baz\', startByte = 28, endByte = 31)], line = void, startByte = 28, endByte = 32)], docComment = \'blah blah\\n\', startByte = 0, endByte = 44), (tokens = [(identifier = \'qux\', startByte = 44, endByte = 47)], line = void, startByte = 44, endByte = 48)])"
                 ,&local_290);
      kj::String::~String(&local_2a8);
      local_281 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_2e0,"foo {bar; baz;}\n# late comment\nqux;");
  doLex<capnp::compiler::LexedStatements>(&local_2d0,(StringPtr)_auStack_2e0);
  pcVar2 = kj::String::cStr(&local_2d0);
  iVar1 = strcmp("(statements = [(tokens = [(identifier = \'foo\', startByte = 0, endByte = 3)], block = [(tokens = [(identifier = \'bar\', startByte = 5, endByte = 8)], line = void, startByte = 5, endByte = 9), (tokens = [(identifier = \'baz\', startByte = 10, endByte = 13)], line = void, startByte = 10, endByte = 14)], docComment = \'late comment\\n\', startByte = 0, endByte = 31), (tokens = [(identifier = \'qux\', startByte = 31, endByte = 34)], line = void, startByte = 31, endByte = 35)])"
                 ,pcVar2);
  kj::String::~String(&local_2d0);
  if (iVar1 != 0) {
    local_2e1 = kj::_::Debug::shouldLog(ERROR);
    while (local_2e1 != false) {
      kj::StringPtr::StringPtr((StringPtr *)&local_318,"foo {bar; baz;}\n# late comment\nqux;");
      doLex<capnp::compiler::LexedStatements>(&local_308,(StringPtr)local_318);
      local_2f0 = kj::String::cStr(&local_308);
      kj::_::Debug::log<char_const(&)[633],char_const(&)[469],char_const*>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/lexer-test.c++"
                 ,0x166,ERROR,
                 "\"failed: expected \" \"::strcmp(\\\"(statements = [\\\" \\\"(\\\" \\\"tokens = [\\\" \\\"(identifier = \'foo\', startByte = 0, endByte = 3)\\\" \\\"], \\\" \\\"block = [\\\" \\\"(tokens = [\\\" \\\"(identifier = \'bar\', startByte = 5, endByte = 8)\\\" \\\"], line = void, startByte = 5, endByte = 9), \\\" \\\"(tokens = [\\\" \\\"(identifier = \'baz\', startByte = 10, endByte = 13)\\\" \\\"], line = void, startByte = 10, endByte = 14)\\\" \\\"], \\\" \\\"docComment = \'late comment\\\\\\\\n\', \\\" \\\"startByte = 0, endByte = 31\\\" \\\"), \\\" \\\"(tokens = [\\\" \\\"(identifier = \'qux\', startByte = 31, endByte = 34)\\\" \\\"], line = void, startByte = 31, endByte = 35)\\\" \\\"])\\\", doLex<LexedStatements>(\\\"foo {bar; baz;}\\\\n# late comment\\\\nqux;\\\").cStr()) == 0\", \"(statements = [\" \"(\" \"tokens = [\" \"(identifier = \'foo\', startByte = 0, endByte = 3)\" \"], \" \"block = [\" \"(tokens = [\" \"(identifier = \'bar\', startByte = 5, endByte = 8)\" \"], line = void, startByte = 5, endByte = 9), \" \"(tokens = [\" \"(identifier = \'baz\', startByte = 10, endByte = 13)\" \"], line = void, startByte = 10, endByte = 14)\" \"], \" \"docComment = \'late comment\\\\n\', \" \"startByte = 0, endByte = 31\" \"), \" \"(tokens = [\" \"(identifier = \'qux\', startByte = 31, endByte = 34)\" \"], line = void, startByte = 31, endByte = 35)\" \"])\", doLex<LexedStatements>(\"foo {bar; baz;}\\n# late comment\\nqux;\").cStr()"
                 ,(char (*) [633])
                  "failed: expected ::strcmp(\"(statements = [\" \"(\" \"tokens = [\" \"(identifier = \'foo\', startByte = 0, endByte = 3)\" \"], \" \"block = [\" \"(tokens = [\" \"(identifier = \'bar\', startByte = 5, endByte = 8)\" \"], line = void, startByte = 5, endByte = 9), \" \"(tokens = [\" \"(identifier = \'baz\', startByte = 10, endByte = 13)\" \"], line = void, startByte = 10, endByte = 14)\" \"], \" \"docComment = \'late comment\\\\n\', \" \"startByte = 0, endByte = 31\" \"), \" \"(tokens = [\" \"(identifier = \'qux\', startByte = 31, endByte = 34)\" \"], line = void, startByte = 31, endByte = 35)\" \"])\", doLex<LexedStatements>(\"foo {bar; baz;}\\n# late comment\\nqux;\").cStr()) == 0"
                 ,(char (*) [469])
                  "(statements = [(tokens = [(identifier = \'foo\', startByte = 0, endByte = 3)], block = [(tokens = [(identifier = \'bar\', startByte = 5, endByte = 8)], line = void, startByte = 5, endByte = 9), (tokens = [(identifier = \'baz\', startByte = 10, endByte = 13)], line = void, startByte = 10, endByte = 14)], docComment = \'late comment\\n\', startByte = 0, endByte = 31), (tokens = [(identifier = \'qux\', startByte = 31, endByte = 34)], line = void, startByte = 31, endByte = 35)])"
                 ,&local_2f0);
      kj::String::~String(&local_308);
      local_2e1 = false;
    }
  }
  return;
}

Assistant:

TEST(Lexer, DocComments) {
  EXPECT_STREQ(
      "(statements = ["
        "("
          "tokens = ["
            "(identifier = 'foo', startByte = 0, endByte = 3)"
          "], "
          "line = void, "
          "docComment = 'blah blah\\n', "
          "startByte = 0, endByte = 16"
        ")"
      "])",
      doLex<LexedStatements>("foo; # blah blah").cStr());

  EXPECT_STREQ(
      "(statements = ["
        "("
          "tokens = ["
            "(identifier = 'foo', startByte = 0, endByte = 3)"
          "], "
          "line = void, "
          "docComment = 'blah blah\\n', "
          "startByte = 0, endByte = 15"
        ")"
      "])",
      doLex<LexedStatements>("foo; #blah blah").cStr());

  EXPECT_STREQ(
      "(statements = ["
        "("
          "tokens = ["
            "(identifier = 'foo', startByte = 0, endByte = 3)"
          "], "
          "line = void, "
          "docComment = ' blah blah\\n', "
          "startByte = 0, endByte = 17"
        ")"
      "])",
      doLex<LexedStatements>("foo; #  blah blah").cStr());

  EXPECT_STREQ(
      "(statements = ["
        "("
          "tokens = ["
            "(identifier = 'foo', startByte = 0, endByte = 3)"
          "], "
          "line = void, "
          "docComment = 'blah blah\\n', "
          "startByte = 0, endByte = 16"
        ")"
      "])",
      doLex<LexedStatements>("foo;\n# blah blah").cStr());

  EXPECT_STREQ(
      "(statements = ["
        "("
          "tokens = ["
            "(identifier = 'foo', startByte = 0, endByte = 3)"
          "], "
          "line = void, "
          "startByte = 0, endByte = 4"
        ")"
      "])",
      doLex<LexedStatements>("foo;\n\n# blah blah").cStr());

  EXPECT_STREQ(
      "(statements = ["
        "("
          "tokens = ["
            "(identifier = 'foo', startByte = 0, endByte = 3)"
          "], "
          "line = void, "
          "docComment = 'bar baz\\nqux corge\\n', "
          "startByte = 0, endByte = 30"
        ")"
      "])",
      doLex<LexedStatements>("foo;\n # bar baz\n  # qux corge\n\n# grault\n# garply").cStr());

  EXPECT_STREQ(
      "(statements = ["
        "("
          "tokens = ["
            "(identifier = 'foo', startByte = 0, endByte = 3)"
          "], "
          "block = ["
            "(tokens = ["
              "(identifier = 'bar', startByte = 17, endByte = 20)"
            "], line = void, docComment = 'hi\\n', startByte = 17, endByte = 27), "
            "(tokens = ["
              "(identifier = 'baz', startByte = 28, endByte = 31)"
            "], line = void, startByte = 28, endByte = 32)"
          "], "
          "docComment = 'blah blah\\n', "
          "startByte = 0, endByte = 44"
        "), "
        "(tokens = ["
          "(identifier = 'qux', startByte = 44, endByte = 47)"
        "], line = void, startByte = 44, endByte = 48)"
      "])",
      doLex<LexedStatements>("foo {# blah blah\nbar; # hi\n baz;} # ignored\nqux;").cStr());

  EXPECT_STREQ(
      "(statements = ["
        "("
          "tokens = ["
            "(identifier = 'foo', startByte = 0, endByte = 3)"
          "], "
          "block = ["
            "(tokens = ["
              "(identifier = 'bar', startByte = 5, endByte = 8)"
            "], line = void, startByte = 5, endByte = 9), "
            "(tokens = ["
              "(identifier = 'baz', startByte = 10, endByte = 13)"
            "], line = void, startByte = 10, endByte = 14)"
          "], "
          "docComment = 'late comment\\n', "
          "startByte = 0, endByte = 31"
        "), "
        "(tokens = ["
          "(identifier = 'qux', startByte = 31, endByte = 34)"
        "], line = void, startByte = 31, endByte = 35)"
      "])",
      doLex<LexedStatements>("foo {bar; baz;}\n# late comment\nqux;").cStr());
}